

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QLibrary::LoadHint,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RSI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  QDebug local_18 [2];
  QDebug *this;
  
  this = *(QDebug **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(local_18,in_RSI);
  ::operator<<(in_RDI,(LoadHint)((ulong)in_RSI >> 0x20));
  QDebug::~QDebug(this);
  QDebug::~QDebug(this);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == this) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }